

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_libapi.cpp
# Opt level: O2

ze_result_t zeInit(ze_init_flags_t flags)

{
  pthread_once_t *__once_control;
  int iVar1;
  long *plVar2;
  undefined8 *puVar3;
  undefined8 uVar4;
  ze_init_flags_t local_24;
  ze_init_flags_t *local_20;
  
  __once_control = ze_lib::context;
  local_20 = &local_24;
  local_24 = flags;
  plVar2 = (long *)__tls_get_addr(&PTR_0023fc60);
  *plVar2 = (long)&local_20;
  puVar3 = (undefined8 *)__tls_get_addr(&PTR_0023fd80);
  *puVar3 = std::once_flag::_Prepare_execution::
            _Prepare_execution<(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/mutex:775:25)>
            ::anon_class_1_0_00000001::__invoke;
  iVar1 = pthread_once(__once_control,__once_proxy);
  if (iVar1 != 0) {
    uVar4 = std::__throw_system_error(iVar1);
    *plVar2 = 0;
    *puVar3 = 0;
    _Unwind_Resume(uVar4);
  }
  *plVar2 = 0;
  *puVar3 = 0;
  if (ze_lib::destruction != '\0') {
    zeInit::result = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  return zeInit::result;
}

Assistant:

ze_result_t ZE_APICALL
zeInit(
    ze_init_flags_t flags                           ///< [in] initialization flags.
                                                    ///< must be 0 (default) or a combination of ::ze_init_flag_t.
    )
{
    static ze_result_t result = ZE_RESULT_SUCCESS;
    #ifdef DYNAMIC_LOAD_LOADER
    if (!ze_lib::context) {
        ze_lib::context = new ze_lib::context_t;
    }
    #endif
    std::call_once(ze_lib::context->initOnce, [flags]() {
        result = ze_lib::context->Init(flags, false, nullptr);

        if( ZE_RESULT_SUCCESS != result )
            return result;

        if(ze_lib::destruction) {
            return ZE_RESULT_ERROR_UNINITIALIZED;
        }

        auto pfnInit = ze_lib::context->zeDdiTable.load()->Global.pfnInit;
        if( nullptr == pfnInit ) {
            if(!ze_lib::context->isInitialized)
                return ZE_RESULT_ERROR_UNINITIALIZED;
            else
                return ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
        }

        result = pfnInit( flags );
        return result;
    });

    if(ze_lib::destruction) {
        result = ZE_RESULT_ERROR_UNINITIALIZED;
    }

    return result;
}